

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenizerBase.cpp
# Opt level: O1

void __thiscall SGParser::TokenizerBase::AdjustHead(TokenizerBase *this)

{
  TokenizerBuffer *pTVar1;
  
  pTVar1 = this->pHeadBuffer;
  if ((pTVar1 != (TokenizerBuffer *)0x0) && (this->pTailBuffer != (TokenizerBuffer *)0x0)) {
    this->pHead = this->pTail;
    if (pTVar1 != this->pTailBuffer) {
      if (this->pFreeBuffer == (TokenizerBuffer *)0x0) {
        this->pFreeBuffer = pTVar1;
        this->pHeadBuffer = pTVar1->pNext;
      }
      while (pTVar1 = this->pHeadBuffer, pTVar1 != this->pTailBuffer) {
        this->pHeadBuffer = pTVar1->pNext;
        if (pTVar1 != (TokenizerBuffer *)0x0) {
          operator_delete(pTVar1,0x2010);
        }
      }
    }
    return;
  }
  __assert_fail("pHeadBuffer && pTailBuffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/TokenizerBase.cpp"
                ,0x84,"void SGParser::TokenizerBase::AdjustHead()");
}

Assistant:

void TokenizerBase::AdjustHead() noexcept {
    SG_ASSERT(pHeadBuffer && pTailBuffer);

    // Move the Head to the Tail
    pHead = pTail;

    // Need to destroy a buffer
    if (pHeadBuffer != pTailBuffer) {
        // Save one of the buffers
        if (!pFreeBuffer) {
            pFreeBuffer = pHeadBuffer;
            pHeadBuffer = pHeadBuffer->pNext;
        }

        // Now go through and destroy all unused buffers
        while (pHeadBuffer != pTailBuffer)
            delete std::exchange(pHeadBuffer, pHeadBuffer->pNext);
    }
}